

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender __thiscall
fmt::v10::detail::digit_grouping<char>::apply<fmt::v10::appender,char>
          (digit_grouping<char> *this,appender out,basic_string_view<char> digits)

{
  long lVar1;
  byte bVar2;
  char cVar3;
  char *begin;
  uint uVar4;
  byte *pbVar5;
  ulong uVar6;
  int iVar7;
  byte *pbVar8;
  int iVar9;
  ulong uVar10;
  undefined **local_820;
  undefined4 *local_818;
  long lStack_810;
  ulong local_808;
  undefined4 local_800 [500];
  
  uVar6 = digits.size_;
  local_818 = local_800;
  local_808 = 500;
  local_820 = &PTR_grow_002264b0;
  local_800[0] = 0;
  pbVar8 = (byte *)(this->grouping_)._M_dataplus._M_p;
  iVar7 = 0;
  lStack_810 = 1;
  do {
    iVar9 = 0x7fffffff;
    if ((this->thousands_sep_)._M_string_length != 0) {
      pbVar5 = (byte *)((this->grouping_)._M_dataplus._M_p + (this->grouping_)._M_string_length);
      if (pbVar8 == pbVar5) {
        uVar4 = (uint)(char)pbVar5[-1];
      }
      else {
        bVar2 = *pbVar8;
        if ((byte)(bVar2 + 0x81) < 0x82) goto LAB_00158eb6;
        pbVar8 = pbVar8 + 1;
        uVar4 = (uint)bVar2;
      }
      iVar9 = iVar7 + uVar4;
      iVar7 = iVar9;
    }
LAB_00158eb6:
    uVar4 = (uint)digits.size_;
    if (iVar9 >= (int)uVar4 || iVar9 == 0) break;
    if (local_808 < lStack_810 + 1U) {
      (*(code *)*local_820)(&local_820);
    }
    lVar1 = lStack_810 + 1;
    local_818[lStack_810] = iVar9;
    lStack_810 = lVar1;
  } while (iVar9 < (int)uVar4 && iVar9 != 0);
  if (0 < (int)uVar4) {
    iVar7 = (int)lStack_810 + -1;
    uVar10 = 0;
    do {
      if ((int)uVar6 == local_818[iVar7]) {
        begin = (this->thousands_sep_)._M_dataplus._M_p;
        buffer<char>::append<char>
                  ((buffer<char> *)
                   out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,begin,
                   begin + (this->thousands_sep_)._M_string_length);
        iVar7 = iVar7 + -1;
      }
      cVar3 = digits.data_[uVar10];
      if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
                    + 0x18) <
          *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
                   + 0x10) + 1U) {
        (*(code *)**(undefined8 **)
                    out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
                  (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
      }
      lVar1 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                              container + 0x10);
      *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
               0x10) = lVar1 + 1;
      *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                container + 8) + lVar1) = cVar3;
      uVar10 = uVar10 + 1;
      uVar6 = (ulong)((int)uVar6 - 1);
    } while ((uVar4 & 0x7fffffff) != uVar10);
  }
  if (local_818 != local_800) {
    operator_delete(local_818,local_808 << 2);
  }
  return (appender)
         out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
}

Assistant:

auto apply(Out out, basic_string_view<C> digits) const -> Out {
    auto num_digits = static_cast<int>(digits.size());
    auto separators = basic_memory_buffer<int>();
    separators.push_back(0);
    auto state = initial_state();
    while (int i = next(state)) {
      if (i >= num_digits) break;
      separators.push_back(i);
    }
    for (int i = 0, sep_index = static_cast<int>(separators.size() - 1);
         i < num_digits; ++i) {
      if (num_digits - i == separators[sep_index]) {
        out =
            copy_str<Char>(thousands_sep_.data(),
                           thousands_sep_.data() + thousands_sep_.size(), out);
        --sep_index;
      }
      *out++ = static_cast<Char>(digits[to_unsigned(i)]);
    }
    return out;
  }